

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_graph.h
# Opt level: O1

void __thiscall ListGraph::ListGraph(ListGraph *this,int node_count,int arc_count)

{
  int *piVar1;
  ulong uVar2;
  
  (this->head).super_ArrayIDFunc<int>.preimage_count_ = arc_count;
  if (arc_count == 0) {
    (this->head).super_ArrayIDFunc<int>.data_ = (int *)0x0;
    (this->head).image_count_ = node_count;
    (this->tail).super_ArrayIDFunc<int>.preimage_count_ = 0;
    piVar1 = (int *)0x0;
  }
  else {
    uVar2 = 0xffffffffffffffff;
    if (-1 < arc_count) {
      uVar2 = (long)arc_count << 2;
    }
    piVar1 = (int *)operator_new__(uVar2);
    (this->head).super_ArrayIDFunc<int>.data_ = piVar1;
    (this->head).image_count_ = node_count;
    (this->tail).super_ArrayIDFunc<int>.preimage_count_ = arc_count;
    piVar1 = (int *)operator_new__(uVar2);
  }
  (this->tail).super_ArrayIDFunc<int>.data_ = piVar1;
  (this->tail).image_count_ = node_count;
  return;
}

Assistant:

ListGraph(int node_count, int arc_count)
        : head(arc_count, node_count)
        , tail(arc_count, node_count)
    {
    }